

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_seek(cram_fd *fd,off_t offset,int whence)

{
  hFILE *fp;
  off_t oVar1;
  ulong __n;
  int iVar2;
  ulong nbytes;
  ulong uVar3;
  char buf [65536];
  undefined1 auStack_10038 [65544];
  
  fd->ooc = 0;
  oVar1 = hseek(fd->fp,offset,whence);
  iVar2 = 0;
  if ((oVar1 < 0) && (iVar2 = -1, -1 < offset && whence == 1)) {
    do {
      if (offset < 1) {
        return 0;
      }
      nbytes = offset;
      if (0xffff < offset) {
        nbytes = 0x10000;
      }
      fp = fd->fp;
      uVar3 = (long)fp->end - (long)fp->begin;
      __n = uVar3;
      if (nbytes <= uVar3) {
        __n = nbytes;
      }
      memcpy(auStack_10038,fp->begin,__n);
      fp->begin = fp->begin + __n;
      if (uVar3 < nbytes) {
        __n = hread2(fp,auStack_10038,nbytes,__n);
      }
      iVar2 = -1;
      uVar3 = nbytes;
      if (nbytes != __n) {
        uVar3 = 0;
      }
      offset = offset - uVar3;
    } while (nbytes == __n);
  }
  return iVar2;
}

Assistant:

int cram_seek(cram_fd *fd, off_t offset, int whence) {
    char buf[65536];

    fd->ooc = 0;

    if (hseek(fd->fp, offset, whence) >= 0)
	return 0;

    if (!(whence == SEEK_CUR && offset >= 0))
	return -1;

    /* Couldn't fseek, but we're in SEEK_CUR mode so read instead */
    while (offset > 0) {
	int len = MIN(65536, offset);
	if (len != hread(fd->fp, buf, len))
	    return -1;
	offset -= len;
    }

    return 0;
}